

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::MergeFrom(Message *this,Message *from)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ClassDataFull *pCVar2;
  ClassData *class_from;
  ClassData *class_to;
  Message *from_local;
  Message *this_local;
  ClassData *this_00;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[4])();
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[4])();
  if ((this_00 == (ClassData *)0x0) || (this_00 != (ClassData *)CONCAT44(extraout_var_00,iVar1))) {
    internal::ReflectionOps::Merge(from,this);
  }
  else {
    pCVar2 = internal::ClassData::full(this_00);
    (*(pCVar2->super_ClassData).merge_to_from)(&this->super_MessageLite,&from->super_MessageLite);
  }
  return;
}

Assistant:

void Message::MergeFrom(const Message& from) {
  auto* class_to = GetClassData();
  auto* class_from = from.GetClassData();
  if (class_to == nullptr || class_to != class_from) {
    ReflectionOps::Merge(from, this);
  } else {
    class_to->full().merge_to_from(*this, from);
  }
}